

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<double,int>(uint length,double value)

{
  long lVar1;
  double *__p;
  int *__p_00;
  undefined8 *puVar2;
  ulong uVar3;
  double *local_48;
  shared_ptr<double> pt;
  shared_ptr<int> pu;
  
  pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  __p = nosimd::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)&local_48,__p,
             nosimd::common::free<double>);
  __p_00 = nosimd::common::malloc<int>(length);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p_00,
             nosimd::common::free<int>);
  nosimd::common::set<double>
            ((double)pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             local_48,length);
  nosimd::common::convert<double,int>
            (local_48,(int *)pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi,length);
  uVar3 = 0;
  do {
    if (length == uVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    lVar1 = uVar3 * 4;
    uVar3 = uVar3 + 1;
  } while (*(int *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar1) ==
           (int)(double)pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = double, _U = int]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}